

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void glist_readfrombinbuf(_glist *x,_binbuf *b,char *filename,int selectem)

{
  undefined4 uVar1;
  int iVar2;
  t_atom *vec_00;
  t_symbol *s;
  t_atom *ptVar3;
  t_template *x1;
  t_template *x2;
  t_atom *ptVar4;
  int local_6c;
  int newnargs;
  int ntemplateargs;
  t_atom *templateargs;
  t_symbol *templatesym;
  t_template *existtemplate;
  t_template *newtemplate;
  t_atom *vec;
  int nextmsg;
  int message;
  int nline;
  int natoms;
  _glist *canvas;
  char *pcStack_20;
  int selectem_local;
  char *filename_local;
  _binbuf *b_local;
  _glist *x_local;
  
  canvas._4_4_ = selectem;
  pcStack_20 = filename;
  filename_local = (char *)b;
  b_local = (_binbuf *)x;
  _nline = glist_getcanvas(x);
  vec._0_4_ = 0;
  message = binbuf_getnatom((_binbuf *)filename_local);
  vec_00 = binbuf_getvec((_binbuf *)filename_local);
  nextmsg = canvas_scanbinbuf(message,vec_00,(int *)((long)&vec + 4),(int *)&vec);
  if (((nextmsg == 1) || (vec_00[vec._4_4_].a_type == A_SYMBOL)) ||
     (iVar2 = strcmp((vec_00[vec._4_4_].a_w.w_symbol)->s_name,"data"), iVar2 == 0)) {
    while( true ) {
      _newnargs = (t_atom *)getbytes(0);
      local_6c = 0;
      nextmsg = canvas_scanbinbuf(message,vec_00,(int *)((long)&vec + 4),(int *)&vec);
      if (nextmsg < 2) break;
      if (nextmsg < 3) {
        if (((vec_00[vec._4_4_].a_type == A_SYMBOL) &&
            (iVar2 = strcmp((vec_00[vec._4_4_].a_w.w_symbol)->s_name,"template"), iVar2 == 0)) &&
           (vec_00[vec._4_4_ + 1].a_type == A_SYMBOL)) goto LAB_00175bd5;
        canvas_readerror(message,vec_00,vec._4_4_,nextmsg,"bad template header");
      }
      else {
        canvas_readerror(message,vec_00,vec._4_4_,nextmsg,"extra items ignored");
LAB_00175bd5:
        s = canvas_makebindsym(vec_00[vec._4_4_ + 1].a_w.w_symbol);
        iVar2 = local_6c;
        while ((local_6c = iVar2,
               nextmsg = canvas_scanbinbuf(message,vec_00,(int *)((long)&vec + 4),(int *)&vec),
               nextmsg == 2 || (nextmsg == 3))) {
          iVar2 = local_6c + nextmsg;
          _newnargs = (t_atom *)resizebytes(_newnargs,(long)local_6c << 4,(long)iVar2 << 4);
          ptVar3 = _newnargs + local_6c;
          ptVar4 = vec_00 + vec._4_4_;
          uVar1 = *(undefined4 *)&ptVar4->field_0x4;
          ptVar3->a_type = ptVar4->a_type;
          *(undefined4 *)&ptVar3->field_0x4 = uVar1;
          ptVar3->a_w = ptVar4->a_w;
          ptVar3 = _newnargs + (local_6c + 1);
          ptVar4 = vec_00 + (vec._4_4_ + 1);
          uVar1 = *(undefined4 *)&ptVar4->field_0x4;
          ptVar3->a_type = ptVar4->a_type;
          *(undefined4 *)&ptVar3->field_0x4 = uVar1;
          ptVar3->a_w = ptVar4->a_w;
          if (nextmsg == 3) {
            ptVar3 = _newnargs + (local_6c + 2);
            ptVar4 = vec_00 + (vec._4_4_ + 2);
            uVar1 = *(undefined4 *)&ptVar4->field_0x4;
            ptVar3->a_type = ptVar4->a_type;
            *(undefined4 *)&ptVar3->field_0x4 = uVar1;
            ptVar3->a_w = ptVar4->a_w;
          }
        }
        x1 = template_findbyname(s);
        if (x1 == (t_template *)0x0) {
          pd_error((void *)0x0,"%s: template not found in current patch",s->s_name);
          freebytes(_newnargs,(long)local_6c << 4);
          return;
        }
        x2 = template_new(s,local_6c,_newnargs);
        freebytes(_newnargs,(long)local_6c << 4);
        iVar2 = template_match(x1,x2);
        if (iVar2 == 0) {
          pd_error((void *)0x0,"%s: template doesn\'t match current one",s->s_name);
          pd_free(&x2->t_pdobj);
          return;
        }
        pd_free(&x2->t_pdobj);
      }
    }
    freebytes(_newnargs,0);
    while ((int)vec < message) {
      canvas_readscalar((_glist *)b_local,message,vec_00,(int *)&vec,canvas._4_4_);
    }
  }
  else {
    pd_error(b_local,"%s: file apparently of wrong type",pcStack_20);
  }
  return;
}

Assistant:

void glist_readfrombinbuf(t_glist *x, const t_binbuf *b, const char *filename, int selectem)
{
    t_canvas *canvas = glist_getcanvas(x);
    int natoms, nline, message, nextmsg = 0;
    t_atom *vec;

    natoms = binbuf_getnatom(b);
    vec = binbuf_getvec(b);


            /* check for file type */
    nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
    if (nline != 1 && vec[message].a_type != A_SYMBOL &&
        strcmp(vec[message].a_w.w_symbol->s_name, "data"))
    {
        pd_error(x, "%s: file apparently of wrong type", filename);
        return;
    }
        /* read in templates and check for consistency */
    while (1)
    {
        t_template *newtemplate, *existtemplate;
        t_symbol *templatesym;
        t_atom *templateargs = getbytes(0);
        int ntemplateargs = 0, newnargs;
        nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
        if (nline < 2)
        {
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            break;
        }
        else if (nline > 2)
            canvas_readerror(natoms, vec, message, nline,
                "extra items ignored");
        else if (vec[message].a_type != A_SYMBOL ||
            strcmp(vec[message].a_w.w_symbol->s_name, "template") ||
            vec[message + 1].a_type != A_SYMBOL)
        {
            canvas_readerror(natoms, vec, message, nline,
                "bad template header");
            continue;
        }
        templatesym = canvas_makebindsym(vec[message + 1].a_w.w_symbol);
        while (1)
        {
            nline = canvas_scanbinbuf(natoms, vec, &message, &nextmsg);
            if (nline != 2 && nline != 3)
                break;
            newnargs = ntemplateargs + nline;
            templateargs = (t_atom *)t_resizebytes(templateargs,
                sizeof(*templateargs) * ntemplateargs,
                sizeof(*templateargs) * newnargs);
            templateargs[ntemplateargs] = vec[message];
            templateargs[ntemplateargs + 1] = vec[message + 1];
            if (nline == 3)
                templateargs[ntemplateargs + 2] = vec[message + 2];
            ntemplateargs = newnargs;
        }
        if (!(existtemplate = template_findbyname(templatesym)))
        {
            pd_error(0, "%s: template not found in current patch",
                templatesym->s_name);
            t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
            return;
        }
        newtemplate = template_new(templatesym, ntemplateargs, templateargs);
        t_freebytes(templateargs, sizeof (*templateargs) * ntemplateargs);
        if (!template_match(existtemplate, newtemplate))
        {
            pd_error(0, "%s: template doesn't match current one",
                templatesym->s_name);
            pd_free(&newtemplate->t_pdobj);
            return;
        }
        pd_free(&newtemplate->t_pdobj);
    }
    while (nextmsg < natoms)
    {
        canvas_readscalar(x, natoms, vec, &nextmsg, selectem);
    }
}